

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O2

int Abc_NtkDsdLocal(Abc_Ntk_t *pNtk,int fVerbose,int fRecursive)

{
  DdManager *pDVar1;
  DdNode *g;
  DdNode **ppDVar2;
  Abc_Ntk_t *pNtk_00;
  int iVar3;
  uint uVar4;
  int iVar5;
  Dsd_Manager_t *dMan;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar6;
  Dsd_Node_t *pDVar7;
  DdNode *n;
  DdNode *pDVar8;
  Dsd_Node_t *p_00;
  Dsd_Node_t **__ptr;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pNode_00;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int local_9c;
  long local_98;
  Abc_Obj_t *local_90;
  Abc_Ntk_t *local_88;
  Dsd_Manager_t *local_80;
  DdNode *local_78;
  ulong local_70;
  int pCounters [11];
  
  pDVar1 = (DdManager *)pNtk->pManFunc;
  pCounters[8] = 0;
  pCounters[9] = 0;
  pCounters[10] = 0;
  pCounters[4] = 0;
  pCounters[5] = 0;
  pCounters[6] = 0;
  pCounters[7] = 0;
  pCounters[0] = 0;
  pCounters[1] = 0;
  pCounters[2] = 0;
  pCounters[3] = 0;
  if ((pNtk->ntkFunc != ABC_FUNC_BDD) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                  ,0x149,"int Abc_NtkDsdLocal(Abc_Ntk_t *, int, int)");
  }
  Abc_NtkMinimumBase(pNtk);
  dMan = Dsd_ManagerStart(pDVar1,pDVar1->size,0);
  p = Vec_PtrAlloc(100);
  for (iVar11 = 0; iVar11 < pNtk->vObjs->nSize; iVar11 = iVar11 + 1) {
    pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vObjs,iVar11);
    if (((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) &&
       (iVar3 = Abc_NodeIsForDsd(pAVar6), iVar3 != 0)) {
      Vec_PtrPush(p,pAVar6);
    }
  }
  lVar12 = 0;
  local_88 = pNtk;
  local_80 = dMan;
  do {
    pNtk_00 = local_88;
    if (p->nSize <= lVar12) {
      Vec_PtrFree(p);
      if (fVerbose != 0) {
        puts("Number of non-decomposable functions:");
        for (uVar10 = 3; uVar10 != 10; uVar10 = uVar10 + 1) {
          printf("Inputs = %d.  Functions = %6d.\n",uVar10 & 0xffffffff,
                 (ulong)(uint)pCounters[uVar10]);
        }
        printf("Inputs > %d.  Functions = %6d.\n",9,(ulong)pCounters._36_8_ >> 0x20);
      }
      Dsd_ManagerStop(dMan);
      iVar11 = Abc_NtkCheck(pNtk_00);
      if (iVar11 == 0) {
        puts("Abc_NtkDsdRecursive: The network check has failed.");
      }
      return (uint)(iVar11 != 0);
    }
    pAVar6 = (Abc_Obj_t *)p->pArray[lVar12];
    pDVar1 = (DdManager *)pAVar6->pNtk->pManFunc;
    pDVar7 = Dsd_DecomposeOne(dMan,(DdNode *)(pAVar6->field_5).pData);
    local_98 = lVar12;
    if ((fRecursive == 0) ||
       (uVar4 = Dsd_NodeReadDecsNum((Dsd_Node_t *)((ulong)pDVar7 & 0xfffffffffffffffe)),
       uVar4 != (pAVar6->vFanins).nSize)) {
      for (lVar12 = 0; lVar12 < (pAVar6->vFanins).nSize; lVar12 = lVar12 + 1) {
        iVar11 = *(int *)(pAVar6->pNtk->vObjs->pArray + (pAVar6->vFanins).pArray[lVar12]);
        p_00 = Dsd_ManagerReadInput(dMan,(int)lVar12);
        Dsd_NodeSetMark(p_00,iVar11);
      }
      __ptr = Dsd_TreeCollectNodesDfsOne
                        (dMan,(Dsd_Node_t *)((ulong)pDVar7 & 0xfffffffffffffffe),&local_9c);
      pAVar9 = (Abc_Obj_t *)0x0;
      for (lVar12 = 0; lVar12 < local_9c; lVar12 = lVar12 + 1) {
        pAVar9 = Abc_NtkDsdConstructNode(dMan,__ptr[lVar12],pAVar6->pNtk,pCounters);
        iVar11 = Abc_NodeIsForDsd(pAVar9);
        if ((fRecursive != 0) && (iVar11 != 0)) {
          Vec_PtrPush(p,pAVar9);
        }
      }
      free(__ptr);
      if (pAVar9 == (Abc_Obj_t *)0x0) {
        __assert_fail("pRoot",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                      ,0x1b0,
                      "void Abc_NodeDecompDsdAndMux(Abc_Obj_t *, Vec_Ptr_t *, Dsd_Manager_t *, int, int *)"
                     );
      }
      Abc_ObjRemoveFanins(pAVar6);
      Abc_ObjAddFanin(pAVar6,pAVar9);
      Cudd_RecursiveDeref(pDVar1,(DdNode *)(pAVar6->field_5).pData);
      pDVar8 = (DdNode *)((ulong)((uint)pDVar7 & 1) ^ (ulong)*pDVar1->vars);
    }
    else {
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      local_70 = (ulong)uVar4;
      local_78 = (DdNode *)(pAVar6->field_5).pData;
      uVar10 = 0xffffffffffffffff;
      iVar11 = 1000000;
      local_90 = pAVar6;
      for (uVar13 = 0; pDVar8 = local_78, pAVar6 = local_90, iVar3 = (int)uVar10, local_70 != uVar13
          ; uVar13 = uVar13 + 1) {
        g = pDVar1->vars[uVar13];
        n = Cudd_Cofactor(pDVar1,local_78,(DdNode *)((ulong)g ^ 1));
        Cudd_Ref(n);
        pDVar8 = Cudd_Cofactor(pDVar1,pDVar8,g);
        Cudd_Ref(pDVar8);
        iVar3 = Cudd_SupportSize(pDVar1,n);
        iVar5 = Cudd_SupportSize(pDVar1,pDVar8);
        dMan = local_80;
        Cudd_RecursiveDeref(pDVar1,n);
        Cudd_RecursiveDeref(pDVar1,pDVar8);
        iVar5 = iVar5 + iVar3;
        iVar3 = iVar11;
        if (iVar5 <= iVar11) {
          iVar3 = iVar5;
        }
        if (iVar5 < iVar11) {
          uVar10 = uVar13;
        }
        uVar10 = uVar10 & 0xffffffff;
        iVar11 = iVar3;
      }
      pAVar9 = (Abc_Obj_t *)local_90->pNtk->vObjs->pArray[(local_90->vFanins).pArray[iVar3]];
      pNode = Abc_NtkCloneObj(local_90);
      pDVar8 = Cudd_Cofactor(pDVar1,(DdNode *)(pAVar6->field_5).pData,
                             (DdNode *)((ulong)pDVar1->vars[iVar3] ^ 1));
      (pNode->field_5).pData = pDVar8;
      Cudd_Ref(pDVar8);
      Abc_NodeMinimumBase(pNode);
      iVar11 = Abc_NodeIsForDsd(pNode);
      if (iVar11 != 0) {
        Vec_PtrPush(p,pNode);
      }
      pNode_00 = Abc_NtkCloneObj(pAVar6);
      pDVar8 = Cudd_Cofactor(pDVar1,(DdNode *)(pAVar6->field_5).pData,pDVar1->vars[iVar3]);
      (pNode_00->field_5).pData = pDVar8;
      Cudd_Ref(pDVar8);
      Abc_NodeMinimumBase(pNode_00);
      iVar11 = Abc_NodeIsForDsd(pNode_00);
      if (iVar11 != 0) {
        Vec_PtrPush(p,pNode_00);
      }
      Abc_ObjRemoveFanins(pAVar6);
      Abc_ObjAddFanin(pAVar6,pAVar9);
      Abc_ObjAddFanin(pAVar6,pNode_00);
      Abc_ObjAddFanin(pAVar6,pNode);
      Cudd_RecursiveDeref(pDVar1,(DdNode *)(pAVar6->field_5).pData);
      ppDVar2 = pDVar1->vars;
      pDVar8 = Cudd_bddIte(pDVar1,*ppDVar2,ppDVar2[1],ppDVar2[2]);
    }
    lVar12 = local_98;
    (pAVar6->field_5).pData = pDVar8;
    Cudd_Ref(pDVar8);
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

int Abc_NtkDsdLocal( Abc_Ntk_t * pNtk, int fVerbose, int fRecursive )
{
    Dsd_Manager_t * pManDsd;
    DdManager * dd = (DdManager *)pNtk->pManFunc;
    Vec_Ptr_t * vNodes;
    int i;
    int pCounters[11] = {0};

    assert( Abc_NtkIsBddLogic(pNtk) );

    // make the network minimum base
    Abc_NtkMinimumBase( pNtk );

    // start the DSD manager
    pManDsd = Dsd_ManagerStart( dd, dd->size, 0 );

    // collect nodes for decomposition
    vNodes = Abc_NtkCollectNodesForDsd( pNtk );
    for ( i = 0; i < vNodes->nSize; i++ )
        Abc_NodeDecompDsdAndMux( (Abc_Obj_t *)vNodes->pArray[i], vNodes, pManDsd, fRecursive, pCounters );
    Vec_PtrFree( vNodes );

    if ( fVerbose )
    {
        printf( "Number of non-decomposable functions:\n" );
        for ( i = 3; i < 10; i++ )
            printf( "Inputs = %d.  Functions = %6d.\n", i, pCounters[i] );
        printf( "Inputs > %d.  Functions = %6d.\n", 9, pCounters[10] );
    }

    // stop the DSD manager
    Dsd_ManagerStop( pManDsd );

    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkDsdRecursive: The network check has failed.\n" );
        return 0;
    }
    return 1;
}